

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O0

int run_test_tty_pty(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_5e0 [8];
  uv_tty_t slave_tty;
  uv_tty_t master_tty;
  uv_loop_t loop;
  winsize w;
  int r;
  int slave_fd;
  int master_fd;
  
  iVar1 = uv_loop_init((uv_loop_t *)&master_tty.orig_termios.c_ospeed);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c",
            0x1bd,"0 == uv_loop_init(&loop)");
    abort();
  }
  w._0_4_ = openpty(&r,&w.ws_xpixel,0,0,&loop.inotify_fd);
  if (w._0_4_ == 0) {
    iVar1 = uv_tty_init((uv_loop_t *)&master_tty.orig_termios.c_ospeed,(uv_tty_t *)local_5e0,w._4_4_
                        ,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x1c3,"0 == uv_tty_init(&loop, &slave_tty, slave_fd, 0)");
      abort();
    }
    iVar1 = uv_tty_init((uv_loop_t *)&master_tty.orig_termios.c_ospeed,
                        (uv_tty_t *)&slave_tty.orig_termios.c_ospeed,r,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x1c4,"0 == uv_tty_init(&loop, &master_tty, master_fd, 0)");
      abort();
    }
    iVar1 = uv_is_readable((uv_stream_t *)local_5e0);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x1c5,"uv_is_readable((uv_stream_t*) &slave_tty)");
      abort();
    }
    iVar1 = uv_is_writable((uv_stream_t *)local_5e0);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x1c6,"uv_is_writable((uv_stream_t*) &slave_tty)");
      abort();
    }
    iVar1 = uv_is_readable((uv_stream_t *)&slave_tty.orig_termios.c_ospeed);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x1c7,"uv_is_readable((uv_stream_t*) &master_tty)");
      abort();
    }
    iVar1 = uv_is_writable((uv_stream_t *)&slave_tty.orig_termios.c_ospeed);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x1c8,"uv_is_writable((uv_stream_t*) &master_tty)");
      abort();
    }
    if (((uint)slave_tty.next_closing & 0x100000) != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x1cc,"0 == (slave_tty.flags & 0x100000)");
      abort();
    }
    if (((uint)master_tty.next_closing & 0x100000) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x1cf,"master_tty.flags & 0x100000");
      abort();
    }
    iVar1 = close(w._4_4_);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x1d0,"0 == close(slave_fd)");
      abort();
    }
    uv_close((uv_handle_t *)local_5e0,(uv_close_cb)0x0);
    iVar1 = close(r);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x1d2,"0 == close(master_fd)");
      abort();
    }
    uv_close((uv_handle_t *)&slave_tty.orig_termios.c_ospeed,(uv_close_cb)0x0);
    iVar1 = uv_run((uv_loop_t *)&master_tty.orig_termios.c_ospeed,UV_RUN_DEFAULT);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x1d5,"0 == uv_run(&loop, UV_RUN_DEFAULT)");
      abort();
    }
    puVar2 = uv_default_loop();
    close_loop(puVar2);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x1d7,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    uv_library_shutdown();
    slave_fd = 0;
  }
  else {
    fprintf(_stderr,"%s\n","No pty available, skipping.");
    fflush(_stderr);
    slave_fd = 1;
  }
  return slave_fd;
}

Assistant:

TEST_IMPL(tty_pty) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
#if defined(__ASAN__)
  RETURN_SKIP("Test does not currently work in ASAN");
#endif

#if defined(__APPLE__)                            || \
    defined(__DragonFly__)                        || \
    defined(__FreeBSD__)                          || \
    defined(__FreeBSD_kernel__)                   || \
    (defined(__linux__) && !defined(__ANDROID__)) || \
    defined(__NetBSD__)                           || \
    defined(__OpenBSD__)
  int master_fd, slave_fd, r;
  struct winsize w;
  uv_loop_t loop;
  uv_tty_t master_tty, slave_tty;

  ASSERT(0 == uv_loop_init(&loop));

  r = openpty(&master_fd, &slave_fd, NULL, NULL, &w);
  if (r != 0)
    RETURN_SKIP("No pty available, skipping.");

  ASSERT(0 == uv_tty_init(&loop, &slave_tty, slave_fd, 0));
  ASSERT(0 == uv_tty_init(&loop, &master_tty, master_fd, 0));
  ASSERT(uv_is_readable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_readable((uv_stream_t*) &master_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &master_tty));
  /* Check if the file descriptor was reopened. If it is,
   * UV_HANDLE_BLOCKING_WRITES (value 0x100000) isn't set on flags.
   */
  ASSERT(0 == (slave_tty.flags & 0x100000));
  /* The master_fd of a pty should never be reopened.
   */
  ASSERT(master_tty.flags & 0x100000);
  ASSERT(0 == close(slave_fd));
  uv_close((uv_handle_t*) &slave_tty, NULL);
  ASSERT(0 == close(master_fd));
  uv_close((uv_handle_t*) &master_tty, NULL);

  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
#endif
  return 0;
}